

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void StartTorControl(CService onion_service_target)

{
  undefined4 uVar1;
  CService *in_RDI;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  thread local_48;
  long *local_40;
  direct_or_indirect local_38;
  undefined4 local_28;
  long local_20;
  undefined2 local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (gBase != (event_base *)0x0) {
    __assert_fail("!gBase",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
                  ,0x2a6,"void StartTorControl(CService)");
  }
  evthread_use_pthreads();
  gBase = (event_base *)event_base_new();
  if (gBase == (event_base *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_00337652;
    logging_function._M_str = "StartTorControl";
    logging_function._M_len = 0xf;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file._M_len = 0x5e;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x2ae,ALL,Info,(ConstevalFormatString<0U>)0x6c0ce2);
  }
  else {
    CService::CService((CService *)&local_38.indirect_contents,in_RDI);
    local_48._M_id._M_thread = (id)0;
    local_40 = (long *)operator_new(0x40);
    uVar1 = local_28;
    *local_40 = (long)&PTR___State_impl_00a164d0;
    local_28 = 0;
    *(undefined4 *)(local_40 + 1) = local_38._0_4_;
    *(undefined4 *)((long)local_40 + 0xc) = local_38._4_4_;
    *(size_type *)(local_40 + 2) = local_38.indirect_contents.capacity;
    *(undefined4 *)((long)local_40 + 0x14) = local_38._12_4_;
    *(undefined4 *)(local_40 + 3) = uVar1;
    local_40[4] = local_20;
    *(undefined2 *)(local_40 + 5) = local_18;
    local_40[6] = (long)"torcontrol";
    local_40[7] = (long)util::TraceThread;
    std::thread::_M_start_thread(&local_48,&local_40,0);
    if (local_40 != (long *)0x0) {
      (**(code **)(*local_40 + 8))();
    }
    std::thread::operator=(&torControlThread,&local_48);
    std::thread::~thread(&local_48);
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_38.indirect_contents);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
LAB_00337652:
      __stack_chk_fail();
    }
  }
  return;
}

Assistant:

void StartTorControl(CService onion_service_target)
{
    assert(!gBase);
#ifdef WIN32
    evthread_use_windows_threads();
#else
    evthread_use_pthreads();
#endif
    gBase = event_base_new();
    if (!gBase) {
        LogPrintf("tor: Unable to create event_base\n");
        return;
    }

    torControlThread = std::thread(&util::TraceThread, "torcontrol", [onion_service_target] {
        TorControlThread(onion_service_target);
    });
}